

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::PopFunctionScope(cmMakefile *this,bool reportError)

{
  PopPolicy(this);
  PopSnapshot(this,reportError);
  PopFunctionBlockerBarrier(this,reportError);
  cmFileLockPool::PopFunctionScope(&this->GlobalGenerator->FileLockPool);
  PopLoopBlockBarrier(this);
  return;
}

Assistant:

void cmMakefile::PopFunctionScope(bool reportError)
{
  this->PopPolicy();

  this->PopSnapshot(reportError);

  this->PopFunctionBlockerBarrier(reportError);

#if !defined(CMAKE_BOOTSTRAP)
  this->GetGlobalGenerator()->GetFileLockPool().PopFunctionScope();
#endif

  this->PopLoopBlockBarrier();
}